

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

void finish_setup(nn *n,vw *all)

{
  features *this;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_t *psVar1;
  ostream *poVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  uint32_t *puVar4;
  feature_index i;
  ulong uVar5;
  __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
  local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  ostream local_1a8;
  
  uVar5 = 0;
  memset(&n->output_layer,0,0x68d0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&n->output_layer,&nn_output_namespace)
  ;
  puVar4 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar4 = &(all->weights).sparse_weights._stride_shift;
  }
  i = 0x1fca64ebL << ((byte)*puVar4 & 0x3f);
  this = (n->output_layer).super_example_predict.feature_space + 0x81;
  this_00 = &(n->output_layer).super_example_predict.feature_space[0x81].space_names;
  for (; uVar5 < n->k; uVar5 = uVar5 + 1) {
    features::push_back(this,1.0,i);
    if ((all->audit != false) || (all->hash_inv == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(&local_1a8,"OutputLayer");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x40);
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (ppVar3,(char (*) [1])0x235f41,&local_1d8);
      std::
      __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>(local_1e8,ppVar3);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    i = i + n->increment;
  }
  psVar1 = &(n->output_layer).num_features;
  *psVar1 = *psVar1 + (ulong)n->k;
  if (n->inpass == false) {
    features::push_back(this,1.0,i);
    if ((all->audit != false) || (all->hash_inv == true)) {
      ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_const_char_(&)[17],_true>
                (ppVar3,(char (*) [1])0x235f41,(char (*) [17])"OutputLayerConst");
      std::
      __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                  *)&ss,ppVar3);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ss);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
    }
    psVar1 = &(n->output_layer).num_features;
    *psVar1 = *psVar1 + 1;
  }
  (n->output_layer).in_use = true;
  memset(&n->hiddenbias,0,0x68d0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&n->hiddenbias,&constant_namespace);
  features::push_back((n->hiddenbias).super_example_predict.feature_space + 0x80,1.0,0xb1c55c);
  if ((all->audit != false) || (all->hash_inv == true)) {
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[11],_true>
              (ppVar3,(char (*) [1])0x235f41,(char (*) [11])"HiddenBias");
    std::
    __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                *)&ss,ppVar3);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&(n->hiddenbias).super_example_predict.feature_space[0x80].space_names,
                (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  }
  (n->hiddenbias).total_sum_feat_sq = (n->hiddenbias).total_sum_feat_sq + 1.0;
  (n->hiddenbias).l.multi.label = 0x7f7fffff;
  (n->hiddenbias).weight = 1.0;
  (n->hiddenbias).in_use = true;
  memset(&n->outputweight,0,0x68d0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&n->outputweight,&nn_output_namespace)
  ;
  features::push_back((n->outputweight).super_example_predict.feature_space + 0x81,
                      *(n->output_layer).super_example_predict.feature_space[0x81].values._begin,
                      *(n->output_layer).super_example_predict.feature_space[0x81].indicies._begin);
  if ((all->audit != false) || (all->hash_inv == true)) {
    ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[13],_true>
              (ppVar3,(char (*) [1])0x235f41,(char (*) [13])"OutputWeight");
    std::
    __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                *)&ss,ppVar3);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&(n->outputweight).super_example_predict.feature_space[0x81].space_names,
                (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  }
  *(n->outputweight).super_example_predict.feature_space[0x81].values._begin = 1.0;
  (n->outputweight).total_sum_feat_sq = (n->outputweight).total_sum_feat_sq + 1.0;
  (n->outputweight).l.multi.label = 0x7f7fffff;
  (n->outputweight).weight = 1.0;
  (n->outputweight).in_use = true;
  n->finished_setup = true;
  return;
}

Assistant:

void finish_setup(nn& n, vw& all)
{
  // TODO: output_layer audit

  memset(&n.output_layer, 0, sizeof(n.output_layer));
  n.output_layer.indices.push_back(nn_output_namespace);
  uint64_t nn_index = nn_constant << all.weights.stride_shift();

  features& fs = n.output_layer.feature_space[nn_output_namespace];
  for (unsigned int i = 0; i < n.k; ++i)
  {
    fs.push_back(1., nn_index);
    if (all.audit || all.hash_inv)
    {
      std::stringstream ss;
      ss << "OutputLayer" << i;
      fs.space_names.push_back(audit_strings_ptr(new audit_strings("", ss.str())));
    }
    nn_index += (uint64_t)n.increment;
  }
  n.output_layer.num_features += n.k;

  if (!n.inpass)
  {
    fs.push_back(1., nn_index);
    if (all.audit || all.hash_inv)
      fs.space_names.push_back(audit_strings_ptr(new audit_strings("", "OutputLayerConst")));
    ++n.output_layer.num_features;
  }

  n.output_layer.in_use = true;

  // TODO: not correct if --noconstant
  memset(&n.hiddenbias, 0, sizeof(n.hiddenbias));
  n.hiddenbias.indices.push_back(constant_namespace);
  n.hiddenbias.feature_space[constant_namespace].push_back(1, (uint64_t)constant);
  if (all.audit || all.hash_inv)
    n.hiddenbias.feature_space[constant_namespace].space_names.push_back(
        audit_strings_ptr(new audit_strings("", "HiddenBias")));
  n.hiddenbias.total_sum_feat_sq++;
  n.hiddenbias.l.simple.label = FLT_MAX;
  n.hiddenbias.weight = 1;
  n.hiddenbias.in_use = true;

  memset(&n.outputweight, 0, sizeof(n.outputweight));
  n.outputweight.indices.push_back(nn_output_namespace);
  features& outfs = n.output_layer.feature_space[nn_output_namespace];
  n.outputweight.feature_space[nn_output_namespace].push_back(outfs.values[0], outfs.indicies[0]);
  if (all.audit || all.hash_inv)
    n.outputweight.feature_space[nn_output_namespace].space_names.push_back(
        audit_strings_ptr(new audit_strings("", "OutputWeight")));
  n.outputweight.feature_space[nn_output_namespace].values[0] = 1;
  n.outputweight.total_sum_feat_sq++;
  n.outputweight.l.simple.label = FLT_MAX;
  n.outputweight.weight = 1;
  n.outputweight.in_use = true;

  n.finished_setup = true;
}